

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_data_converter_init_preallocated
                    (ma_data_converter_config *pConfig,void *pHeap,ma_data_converter *pConverter)

{
  ma_bool32 mVar1;
  ma_format mVar2;
  ma_result mVar3;
  ma_format *in_RDX;
  void *in_RSI;
  ma_data_converter_config *in_RDI;
  ma_resampler_config resamplerConfig;
  ma_channel_converter_config channelConverterConfig;
  ma_bool32 isResamplingRequired;
  ma_format midFormat;
  ma_data_converter_heap_layout heapLayout;
  ma_result result;
  ma_resampler *in_stack_ffffffffffffff38;
  void *in_stack_ffffffffffffff40;
  ma_resampler_config *in_stack_ffffffffffffff48;
  ma_data_converter_config *in_stack_ffffffffffffff80;
  void *in_stack_ffffffffffffffa0;
  ma_channel_converter_config *in_stack_ffffffffffffffa8;
  ma_data_converter_heap_layout *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  ma_result local_24;
  
  if (in_RDX == (ma_format *)0x0) {
    local_24 = MA_INVALID_ARGS;
  }
  else {
    if (in_RDX != (ma_format *)0x0) {
      memset(in_RDX,0,0x138);
    }
    local_24 = ma_data_converter_get_heap_layout
                         ((ma_data_converter_config *)
                          CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                          in_stack_ffffffffffffffb0);
    if (local_24 == MA_SUCCESS) {
      *(void **)(in_RDX + 0x4c) = in_RSI;
      if ((in_RSI != (void *)0x0) && (in_stack_ffffffffffffffa0 != (void *)0x0)) {
        memset(in_RSI,0,(size_t)in_stack_ffffffffffffffa0);
      }
      *in_RDX = in_RDI->formatIn;
      in_RDX[1] = in_RDI->formatOut;
      in_RDX[2] = in_RDI->channelsIn;
      in_RDX[3] = in_RDI->channelsOut;
      in_RDX[4] = in_RDI->sampleRateIn;
      in_RDX[5] = in_RDI->sampleRateOut;
      in_RDX[6] = in_RDI->ditherMode;
      mVar1 = ma_data_converter_config_is_resampler_required(in_RDI);
      mVar2 = ma_data_converter_config_get_mid_format
                        ((ma_data_converter_config *)in_stack_ffffffffffffff38);
      ma_channel_converter_config_init_from_data_converter_config(in_stack_ffffffffffffff80);
      local_24 = ma_channel_converter_init_preallocated
                           (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                            (ma_channel_converter *)CONCAT44(mVar2,mVar1));
      if (local_24 == MA_SUCCESS) {
        if (in_RDX[0xc] != ma_format_u8) {
          *(byte *)((long)in_RDX + 0x12a) = 1;
        }
        if (mVar1 != 0) {
          ma_resampler_config_init_from_data_converter_config(in_stack_ffffffffffffff80);
          mVar3 = ma_resampler_init_preallocated
                            (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                             in_stack_ffffffffffffff38);
          if (mVar3 != MA_SUCCESS) {
            return mVar3;
          }
          *(byte *)((long)in_RDX + 299) = 1;
        }
        if ((*(byte *)((long)in_RDX + 0x12a) == 0) && (*(byte *)((long)in_RDX + 299) == 0)) {
          if (*in_RDX == in_RDX[1]) {
            *(undefined1 *)(in_RDX + 0x4a) = ma_format_unknown;
            *(byte *)((long)in_RDX + 0x129) = 0;
          }
          else {
            *(undefined1 *)(in_RDX + 0x4a) = ma_format_unknown;
            *(byte *)((long)in_RDX + 0x129) = 1;
          }
        }
        else {
          if (*in_RDX != mVar2) {
            *(undefined1 *)(in_RDX + 0x4a) = ma_format_u8;
          }
          if (in_RDX[1] != mVar2) {
            *(byte *)((long)in_RDX + 0x129) = 1;
          }
        }
        if (((((char)in_RDX[0x4a] == ma_format_unknown) && (*(byte *)((long)in_RDX + 0x129) == 0))
            && (*(byte *)((long)in_RDX + 0x12a) == 0)) && (*(byte *)((long)in_RDX + 299) == 0)) {
          *(undefined1 *)(in_RDX + 0x4b) = ma_format_u8;
        }
        if ((char)in_RDX[0x4b] == ma_format_unknown) {
          if (in_RDX[2] < in_RDX[3]) {
            if (*(byte *)((long)in_RDX + 299) == 0) {
              in_RDX[7] = ma_format_s16;
            }
            else {
              in_RDX[7] = ma_format_s32;
            }
          }
          else if (*(byte *)((long)in_RDX + 0x12a) == 0) {
            if (*(byte *)((long)in_RDX + 299) == 0) {
              in_RDX[7] = ma_format_u8;
            }
            else {
              in_RDX[7] = ma_format_s24;
            }
          }
          else if (*(byte *)((long)in_RDX + 299) == 0) {
            in_RDX[7] = ma_format_s16;
          }
          else {
            in_RDX[7] = ma_format_f32;
          }
        }
        else {
          in_RDX[7] = ma_format_unknown;
        }
        local_24 = MA_SUCCESS;
      }
    }
  }
  return local_24;
}

Assistant:

MA_API ma_result ma_data_converter_init_preallocated(const ma_data_converter_config* pConfig, void* pHeap, ma_data_converter* pConverter)
{
    ma_result result;
    ma_data_converter_heap_layout heapLayout;
    ma_format midFormat;
    ma_bool32 isResamplingRequired;

    if (pConverter == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pConverter);

    result = ma_data_converter_get_heap_layout(pConfig, &heapLayout);
    if (result != MA_SUCCESS) {
        return result;
    }

    pConverter->_pHeap = pHeap;
    MA_ZERO_MEMORY(pHeap, heapLayout.sizeInBytes);

    pConverter->formatIn      = pConfig->formatIn;
    pConverter->formatOut     = pConfig->formatOut;
    pConverter->channelsIn    = pConfig->channelsIn;
    pConverter->channelsOut   = pConfig->channelsOut;
    pConverter->sampleRateIn  = pConfig->sampleRateIn;
    pConverter->sampleRateOut = pConfig->sampleRateOut;
    pConverter->ditherMode    = pConfig->ditherMode;

    /*
    Determine if resampling is required. We need to do this so we can determine an appropriate
    mid format to use. If resampling is required, the mid format must be ma_format_f32 since
    that is the only one that is guaranteed to supported by custom resampling backends.
    */
    isResamplingRequired = ma_data_converter_config_is_resampler_required(pConfig);
    midFormat = ma_data_converter_config_get_mid_format(pConfig);


    /* Channel converter. We always initialize this, but we check if it configures itself as a passthrough to determine whether or not it's needed. */
    {
        ma_channel_converter_config channelConverterConfig = ma_channel_converter_config_init_from_data_converter_config(pConfig);

        result = ma_channel_converter_init_preallocated(&channelConverterConfig, ma_offset_ptr(pHeap, heapLayout.channelConverterOffset), &pConverter->channelConverter);
        if (result != MA_SUCCESS) {
            return result;
        }

        /* If the channel converter is not a passthrough we need to enable it. Otherwise we can skip it. */
        if (pConverter->channelConverter.conversionPath != ma_channel_conversion_path_passthrough) {
            pConverter->hasChannelConverter = MA_TRUE;
        }
    }


    /* Resampler. */
    if (isResamplingRequired) {
        ma_resampler_config resamplerConfig = ma_resampler_config_init_from_data_converter_config(pConfig);

        result = ma_resampler_init_preallocated(&resamplerConfig, ma_offset_ptr(pHeap, heapLayout.resamplerOffset), &pConverter->resampler);
        if (result != MA_SUCCESS) {
            return result;
        }

        pConverter->hasResampler = MA_TRUE;
    }


    /* We can simplify pre- and post-format conversion if we have neither channel conversion nor resampling. */
    if (pConverter->hasChannelConverter == MA_FALSE && pConverter->hasResampler == MA_FALSE) {
        /* We have neither channel conversion nor resampling so we'll only need one of pre- or post-format conversion, or none if the input and output formats are the same. */
        if (pConverter->formatIn == pConverter->formatOut) {
            /* The formats are the same so we can just pass through. */
            pConverter->hasPreFormatConversion  = MA_FALSE;
            pConverter->hasPostFormatConversion = MA_FALSE;
        } else {
            /* The formats are different so we need to do either pre- or post-format conversion. It doesn't matter which. */
            pConverter->hasPreFormatConversion  = MA_FALSE;
            pConverter->hasPostFormatConversion = MA_TRUE;
        }
    } else {
        /* We have a channel converter and/or resampler so we'll need channel conversion based on the mid format. */
        if (pConverter->formatIn != midFormat) {
            pConverter->hasPreFormatConversion  = MA_TRUE;
        }
        if (pConverter->formatOut != midFormat) {
            pConverter->hasPostFormatConversion = MA_TRUE;
        }
    }

    /* We can enable passthrough optimizations if applicable. Note that we'll only be able to do this if the sample rate is static. */
    if (pConverter->hasPreFormatConversion  == MA_FALSE &&
        pConverter->hasPostFormatConversion == MA_FALSE &&
        pConverter->hasChannelConverter     == MA_FALSE &&
        pConverter->hasResampler            == MA_FALSE) {
        pConverter->isPassthrough = MA_TRUE;
    }


    /* We now need to determine our execution path. */
    if (pConverter->isPassthrough) {
        pConverter->executionPath = ma_data_converter_execution_path_passthrough;
    } else {
        if (pConverter->channelsIn < pConverter->channelsOut) {
            /* Do resampling first, if necessary. */
            MA_ASSERT(pConverter->hasChannelConverter == MA_TRUE);

            if (pConverter->hasResampler) {
                pConverter->executionPath = ma_data_converter_execution_path_resample_first;
            } else {
                pConverter->executionPath = ma_data_converter_execution_path_channels_only;
            }
        } else {
            /* Do channel conversion first, if necessary. */
            if (pConverter->hasChannelConverter) {
                if (pConverter->hasResampler) {
                    pConverter->executionPath = ma_data_converter_execution_path_channels_first;
                } else {
                    pConverter->executionPath = ma_data_converter_execution_path_channels_only;
                }
            } else {
                /* Channel routing not required. */
                if (pConverter->hasResampler) {
                    pConverter->executionPath = ma_data_converter_execution_path_resample_only;
                } else {
                    pConverter->executionPath = ma_data_converter_execution_path_format_only;
                }
            }
        }
    }

    return MA_SUCCESS;
}